

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassXid
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  string local_30;
  
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (&local_30,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,desc);
  io::Printer::Print(printer,"\n\n$class$.prototype.messageXid = xid(\'$class$\');\n","class",
                     &local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Generator::GenerateClassXid(const GeneratorOptions& options,
                                 io::Printer* printer,
                                 const Descriptor* desc) const {
  printer->Print(
      "\n"
      "\n"
      "$class$.prototype.messageXid = xid('$class$');\n",
      "class", GetMessagePath(options, desc));
}